

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menudef.cpp
# Opt level: O0

EColorRange ParseOptionColor(FScanner *sc,FOptionMenuDescriptor *desc)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  FName local_20;
  EColorRange local_1c;
  FOptionMenuDescriptor *pFStack_18;
  EColorRange cr;
  FOptionMenuDescriptor *desc_local;
  FScanner *sc_local;
  
  local_1c = OptionSettings.mFontColor;
  pFStack_18 = desc;
  desc_local = (FOptionMenuDescriptor *)sc;
  bVar1 = FScanner::CheckString(sc,",");
  if (bVar1) {
    FScanner::MustGetString((FScanner *)desc_local);
    FName::FName(&local_20,(char *)(desc_local->super_FMenuDescriptor)._vptr_FMenuDescriptor);
    local_1c = V_FindFontColor(&local_20);
    if ((((local_1c == CR_UNTRANSLATED) &&
         (bVar1 = FScanner::Compare((FScanner *)desc_local,"untranslated"), !bVar1)) &&
        (iVar2 = isdigit((int)*(char *)(desc_local->super_FMenuDescriptor)._vptr_FMenuDescriptor),
        iVar2 != 0)) &&
       (lVar3 = strtol((char *)(desc_local->super_FMenuDescriptor)._vptr_FMenuDescriptor,
                       (char **)0x0,0), lVar3 != 0)) {
      local_1c = OptionSettings.mFontColorHeader;
    }
  }
  return local_1c;
}

Assistant:

static EColorRange ParseOptionColor(FScanner &sc, FOptionMenuDescriptor *desc)
{
	EColorRange cr = OptionSettings.mFontColor;
	if (sc.CheckString(","))
	{
		sc.MustGetString();
		cr = V_FindFontColor(sc.String);
		if (cr == CR_UNTRANSLATED && !sc.Compare("untranslated") && isdigit(sc.String[0]))
		{
			if (strtol(sc.String, NULL, 0)) cr = OptionSettings.mFontColorHeader;
		}
	}
	return cr;
}